

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataCollection::ComputeHeapSizes
               (Vector *heap_sizes_v,Vector *source_v,TupleDataVectorFormat *source_format,
               SelectionVector *append_sel,idx_t append_count)

{
  ValidityMask *this;
  PhysicalType PVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  Vector *source_v_00;
  reference pvVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference this_01;
  type source_v_01;
  NotImplementedException *this_02;
  idx_t struct_col_idx;
  ulong uVar7;
  idx_t i;
  ulong uVar8;
  idx_t iVar9;
  idx_t row_idx;
  string_t sVar10;
  allocator local_81;
  data_ptr_t local_80;
  Vector *local_78;
  string local_70;
  string local_50;
  
  PVar1 = (source_v->type).physical_type_;
  if (((PVar1 < 0x1e) && ((0x21800000U >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 == VARCHAR)) {
    local_80 = heap_sizes_v->data;
    pSVar3 = (source_format->unified).sel;
    this = &(source_format->unified).validity;
    local_78 = heap_sizes_v;
    if (PVar1 == LIST) {
      for (uVar8 = 0; append_count != uVar8; uVar8 = uVar8 + 1) {
        uVar7 = uVar8;
        if (append_sel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)append_sel->sel_vector[uVar8];
        }
        if (pSVar3->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)pSVar3->sel_vector[uVar7];
        }
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this->super_TemplatedValidityMask<unsigned_long>,uVar7);
        if (bVar5) {
          *(long *)(local_80 + uVar8 * 8) = *(long *)(local_80 + uVar8 * 8) + 8;
        }
      }
      source_v_00 = ListVector::GetEntry(source_v);
LAB_016cff0f:
      pvVar6 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(&source_format->children,0);
      WithinCollectionComputeHeapSizes
                (local_78,source_v_00,pvVar6,append_sel,append_count,&source_format->unified);
      return;
    }
    if (PVar1 == STRUCT) {
      this_00 = StructVector::GetEntries(source_v);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)(this_00->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_00->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1)
      {
        this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_00,uVar8);
        pvVar6 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>
                           (&source_format->children,uVar8);
        source_v_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(this_01);
        ComputeHeapSizes(local_78,source_v_01,pvVar6,append_sel,append_count);
      }
    }
    else {
      if (PVar1 != VARCHAR) {
        if (PVar1 != ARRAY) {
          this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_50,"ComputeHeapSizes for %s",&local_81);
          EnumUtil::ToString<duckdb::LogicalTypeId>(&local_70,(source_v->type).id_);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_02,&local_50,&local_70);
          __cxa_throw(this_02,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        for (uVar8 = 0; append_count != uVar8; uVar8 = uVar8 + 1) {
          uVar7 = uVar8;
          if (append_sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)append_sel->sel_vector[uVar8];
          }
          if (pSVar3->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)pSVar3->sel_vector[uVar7];
          }
          bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this->super_TemplatedValidityMask<unsigned_long>,uVar7);
          if (bVar5) {
            *(long *)(local_80 + uVar8 * 8) = *(long *)(local_80 + uVar8 * 8) + 8;
          }
        }
        source_v_00 = ArrayVector::GetEntry(source_v);
        goto LAB_016cff0f;
      }
      pdVar4 = (source_format->unified).data;
      for (iVar9 = 0; append_count != iVar9; iVar9 = iVar9 + 1) {
        row_idx = iVar9;
        if (append_sel->sel_vector != (sel_t *)0x0) {
          row_idx = (idx_t)append_sel->sel_vector[iVar9];
        }
        if (pSVar3->sel_vector != (sel_t *)0x0) {
          row_idx = (idx_t)pSVar3->sel_vector[row_idx];
        }
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (bVar5) {
          uVar2 = *(uint *)(pdVar4 + row_idx * 0x10);
          uVar8 = (ulong)uVar2;
          if (uVar2 < 0xd) {
            uVar8 = 0;
          }
          *(ulong *)(local_80 + iVar9 * 8) = *(long *)(local_80 + iVar9 * 8) + uVar8;
        }
        else {
          sVar10 = NullValue<duckdb::string_t>();
          uVar8 = 0;
          if (0xc < sVar10.value._0_4_) {
            uVar8 = (ulong)sVar10.value._0_4_;
          }
          *(ulong *)(local_80 + iVar9 * 8) = *(long *)(local_80 + iVar9 * 8) + uVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void TupleDataCollection::ComputeHeapSizes(Vector &heap_sizes_v, const Vector &source_v,
                                           TupleDataVectorFormat &source_format, const SelectionVector &append_sel,
                                           const idx_t append_count) {
	const auto type = source_v.GetType().InternalType();
	if (type != PhysicalType::VARCHAR && type != PhysicalType::STRUCT && type != PhysicalType::LIST &&
	    type != PhysicalType::ARRAY) {
		return;
	}

	auto heap_sizes = FlatVector::GetData<idx_t>(heap_sizes_v);

	// Source
	const auto &source_vector_data = source_format.unified;
	const auto &source_sel = *source_vector_data.sel;
	const auto &source_validity = source_vector_data.validity;

	switch (type) {
	case PhysicalType::VARCHAR: {
		// Only non-inlined strings are stored in the heap
		const auto source_data = UnifiedVectorFormat::GetData<string_t>(source_vector_data);
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += StringHeapSize(source_data[source_idx]);
			} else {
				heap_sizes[i] += StringHeapSize(NullValue<string_t>());
			}
		}
		break;
	}
	case PhysicalType::STRUCT: {
		// Recurse through the struct children
		auto &struct_sources = StructVector::GetEntries(source_v);
		for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
			const auto &struct_source = struct_sources[struct_col_idx];
			auto &struct_format = source_format.children[struct_col_idx];
			ComputeHeapSizes(heap_sizes_v, *struct_source, struct_format, append_sel, append_count);
		}
		break;
	}
	case PhysicalType::LIST: {
		// Lists are stored entirely in the heap
		for (idx_t i = 0; i < append_count; i++) {
			auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += sizeof(uint64_t); // Size of the list
			}
		}

		// Recurse
		D_ASSERT(source_format.children.size() == 1);
		auto &child_source_v = ListVector::GetEntry(source_v);
		auto &child_format = source_format.children[0];
		WithinCollectionComputeHeapSizes(heap_sizes_v, child_source_v, child_format, append_sel, append_count,
		                                 source_vector_data);
		break;
	}
	case PhysicalType::ARRAY: {
		// Arrays are stored entirely in the heap
		for (idx_t i = 0; i < append_count; i++) {
			auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (source_validity.RowIsValid(source_idx)) {
				heap_sizes[i] += sizeof(uint64_t); // Size of the list
			}
		}

		// Recurse
		D_ASSERT(source_format.children.size() == 1);
		auto &child_source_v = ArrayVector::GetEntry(source_v);
		auto &child_format = source_format.children[0];
		WithinCollectionComputeHeapSizes(heap_sizes_v, child_source_v, child_format, append_sel, append_count,
		                                 source_vector_data);
		break;
	}
	default:
		throw NotImplementedException("ComputeHeapSizes for %s", EnumUtil::ToString(source_v.GetType().id()));
	}
}